

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

time_t __thiscall Pathie::Path::mtime(Path *this)

{
  int iVar1;
  ErrnoError *this_00;
  int *piVar2;
  string nstr;
  stat s;
  
  utf8_to_filename(&nstr,&this->m_path);
  iVar1 = ::stat(nstr._M_dataplus._M_p,(stat *)&s);
  if (-1 < iVar1) {
    std::__cxx11::string::_M_dispose();
    return s.st_mtim.tv_sec;
  }
  this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
  piVar2 = __errno_location();
  ErrnoError::ErrnoError(this_00,*piVar2);
  __cxa_throw(this_00,&ErrnoError::typeinfo,GlobError::~GlobError);
}

Assistant:

time_t Path::mtime() const
{
#if defined(_PATHIE_UNIX)
  struct stat s;
  std::string nstr = native();

  if (::stat(nstr.c_str(), &s) < 0)
    throw(Pathie::ErrnoError(errno));
#elif defined(_WIN32)
  struct _stat s;
  std::wstring utf16 = utf8_to_utf16(m_path);

  if (_wstat(utf16.c_str(), &s) < 0)
    throw(Pathie::ErrnoError(errno));
#else
#error Unsupported system.
#endif

  return s.st_mtime;
}